

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.hpp
# Opt level: O3

void __thiscall
glcts::GeometryShaderMaxUniformComponentsTest::~GeometryShaderMaxUniformComponentsTest
          (GeometryShaderMaxUniformComponentsTest *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer piVar2;
  pointer pcVar3;
  
  (this->super_GeometryShaderLimitsTransformFeedbackBase).super_TestCaseBase.super_TestCase.
  super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GeometryShaderMaxUniformComponentsTest_02110750;
  piVar2 = (this->m_uniform_data).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2,(long)(this->m_uniform_data).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar2);
  }
  pcVar3 = (this->m_max_uniform_vectors_string)._M_dataplus._M_p;
  paVar1 = &(this->m_max_uniform_vectors_string).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  (this->super_GeometryShaderLimitsTransformFeedbackBase).super_TestCaseBase.super_TestCase.
  super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCaseBase_0210f178;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->super_GeometryShaderLimitsTransformFeedbackBase).super_TestCaseBase.
               m_specializationMap._M_t);
  tcu::TestCase::~TestCase((TestCase *)this);
  return;
}

Assistant:

virtual ~GeometryShaderMaxUniformComponentsTest()
	{
	}